

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O1

bool __thiscall
kj::anon_unknown_59::InMemoryDirectory::ReplacerImpl<kj::Directory>::tryCommit
          (ReplacerImpl<kj::Directory> *this)

{
  MutexGuarded<kj::(anonymous_namespace)::InMemoryDirectory::Impl> *this_00;
  Impl *pIVar1;
  char cVar2;
  InMemoryDirectory *pIVar3;
  size_t sVar4;
  long lVar5;
  char *pcVar6;
  InMemoryFileFactory *pIVar7;
  bool bVar8;
  StringPtr name;
  Fault f;
  InMemoryFileFactory *local_50;
  undefined8 local_48;
  Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl> lock;
  
  pIVar7 = local_50;
  cVar2 = (this->super_Replacer<kj::Directory>).field_0xc;
  lock.mutex = (Mutex *)(CONCAT71(lock.mutex._1_7_,cVar2) ^ 1);
  if (cVar2 == '\0') {
    pIVar3 = (this->directory).ptr;
    this_00 = &pIVar3->impl;
    f.exception._0_1_ = 0;
    _::Mutex::lock(&this_00->mutex,0);
    pIVar1 = &(pIVar3->impl).value;
    sVar4 = (this->name).content.size_;
    if (sVar4 == 0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (this->name).content.ptr;
    }
    name.content.size_ = (size_t)pcVar6;
    name.content.ptr = (char *)pIVar1;
    lock.mutex = &this_00->mutex;
    lock.ptr = pIVar1;
    Impl::openEntry((Impl *)&f,name,(int)sVar4 + (uint)(sVar4 == 0));
    lVar5 = CONCAT71(f.exception._1_7_,f.exception._0_1_);
    bVar8 = lVar5 != 0;
    if (bVar8) {
      (*(((this->inner).ptr)->super_ReadableDirectory).super_FsNode._vptr_FsNode[5])(&f);
      if (local_50 == (InMemoryFileFactory *)0x0) {
        local_48 = 0;
        pIVar7 = (InMemoryFileFactory *)0x0;
      }
      else {
        local_48._1_7_ = f.exception._1_7_;
        local_48._0_1_ = f.exception._0_1_;
        local_50 = (InMemoryFileFactory *)0x0;
      }
      if (local_50 != (InMemoryFileFactory *)0x0) {
        (*(code *)**(undefined8 **)CONCAT71(f.exception._1_7_,f.exception._0_1_))();
      }
      if (*(int *)(lVar5 + 0x18) != 0) {
        OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
        ::destroy((OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
                   *)(lVar5 + 0x18));
      }
      *(undefined8 *)(lVar5 + 0x20) = local_48;
      *(InMemoryFileFactory **)(lVar5 + 0x28) = pIVar7;
      *(undefined4 *)(lVar5 + 0x18) = 2;
      lVar5 = (*(code *)**(undefined8 **)pIVar1->clock)();
      (pIVar3->impl).value.lastModified.value.value = lVar5;
    }
    _::Mutex::unlock(&this_00->mutex,EXCLUSIVE,(Waiter *)0x0);
  }
  else {
    _::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[24]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
               ,0x5d3,FAILED,"!committed","_kjCondition,\"commit() already called\"",
               (DebugExpression<bool> *)&lock,(char (*) [24])"commit() already called");
    _::Debug::Fault::~Fault(&f);
    bVar8 = true;
  }
  return bVar8;
}

Assistant:

bool tryCommit() override {
      KJ_REQUIRE(!committed, "commit() already called") { return true; }

      auto lock = directory->impl.lockExclusive();
      KJ_IF_SOME(entry, lock->openEntry(name, Replacer<T>::mode)) {
        entry.set(inner->clone());
        lock->modified();
        return true;
      } else {
        return false;
      }
    }